

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

int Wlc_ObjHasArithm_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  Wlc_Obj_t *pObj_00;
  undefined1 local_29;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) == (undefined1  [24])0x6)
  {
    p_local._4_4_ = 0;
  }
  else if (((((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
              (undefined1  [24])0x7) ||
            ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
             (undefined1  [24])0xf)) ||
           ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x18)) ||
          ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x19)) {
    pObj_00 = Wlc_ObjFanin0(p,pObj);
    p_local._4_4_ = Wlc_ObjHasArithm_rec(p,pObj_00);
  }
  else {
    local_29 = true;
    if ((((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x2b) &&
        (local_29 = true,
        (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x2c)) &&
       (local_29 = true,
       (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
       (undefined1  [24])0x2d)) {
      local_29 = (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
                 (undefined1  [24])0x32;
    }
    p_local._4_4_ = (uint)local_29;
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_ObjHasArithm_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    if ( pObj->Type == WLC_OBJ_CONST )
        return 0;
    if ( pObj->Type == WLC_OBJ_BUF         || pObj->Type == WLC_OBJ_BIT_NOT ||
         pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT )
         return Wlc_ObjHasArithm_rec( p, Wlc_ObjFanin0(p, pObj) );
    return pObj->Type == WLC_OBJ_ARI_ADD   || pObj->Type == WLC_OBJ_ARI_SUB || 
           pObj->Type == WLC_OBJ_ARI_MULTI || pObj->Type == WLC_OBJ_ARI_MINUS;
}